

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<float> * __thiscall
Imath_3_2::Quat<float>::setRotation(Quat<float> *this,Vec3<float> *from,Vec3<float> *to)

{
  Quat<float> *in_RDI;
  float fVar1;
  Vec3<float> f02;
  Quat<float> q;
  Vec3<float> h0;
  Vec3<float> t0;
  Vec3<float> f0;
  Vec3<float> *in_stack_ffffffffffffff30;
  Vec3<float> *in_stack_ffffffffffffff38;
  Quat<float> *in_stack_ffffffffffffff48;
  Vec3<float> *in_stack_ffffffffffffff50;
  Vec3<float> *in_stack_ffffffffffffff58;
  Quat<float> *in_stack_ffffffffffffff60;
  Vec3<float> local_94;
  Quat<float> *in_stack_ffffffffffffff78;
  Quat<float> *in_stack_ffffffffffffff80;
  Vec3<float> local_70;
  float local_64;
  float local_60;
  float local_5c;
  
  Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
  Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
  fVar1 = Vec3<float>::operator^(in_stack_ffffffffffffff30,(Vec3<float> *)in_RDI);
  if (fVar1 < 0.0) {
    Vec3<float>::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
    fVar1 = Vec3<float>::operator^(in_stack_ffffffffffffff30,(Vec3<float> *)in_RDI);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      setRotationInternal(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      Quat((Quat<float> *)0x18a30a);
      setRotationInternal(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      operator*=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      in_RDI->r = 0.0;
      Vec3<float>::operator*(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if ((local_60 < local_64) || (local_5c < local_64)) {
        if (local_5c < local_60) {
          Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff30,0.0,0.0,1.0);
          Vec3<float>::operator%(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
          Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
          Vec3<float>::operator=(&in_RDI->v,(Vec3<float> *)&stack0xffffffffffffff48);
        }
        else {
          Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff54,0.0,1.0,0.0);
          Vec3<float>::operator%(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
          Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
          Vec3<float>::operator=(&in_RDI->v,&local_94);
        }
      }
      else {
        Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff78,1.0,0.0,0.0);
        Vec3<float>::operator%(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        Vec3<float>::normalized((Vec3<float> *)in_stack_ffffffffffffff48);
        Vec3<float>::operator=(&in_RDI->v,&local_70);
      }
    }
  }
  else {
    setRotationInternal(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>&
Quat<T>::setRotation (const Vec3<T>& from, const Vec3<T>& to) IMATH_NOEXCEPT
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized ();
    Vec3<T> t0 = to.normalized ();

    if ((f0 ^ t0) >= 0)
    {
        //
        // The rotation angle is less than or equal to pi/2.
        //

        setRotationInternal (f0, t0, *this);
    }
    else
    {
        //
        // The angle is greater than pi/2.  After computing h0,
        // which is halfway between f0 and t0, we rotate first
        // from f0 to h0, then from h0 to t0.
        //

        Vec3<T> h0 = (f0 + t0).normalized ();

        if ((h0 ^ h0) != 0)
        {
            setRotationInternal (f0, h0, *this);

            Quat<T> q;
            setRotationInternal (h0, t0, q);

            *this *= q;
        }
        else
        {
            //
            // f0 and t0 point in exactly opposite directions.
            // Pick an arbitrary axis that is orthogonal to f0,
            // and rotate by pi.
            //

            r = T (0);

            Vec3<T> f02 = f0 * f0;

            if (f02.x <= f02.y && f02.x <= f02.z)
                v = (f0 % Vec3<T> (1, 0, 0)).normalized ();
            else if (f02.y <= f02.z)
                v = (f0 % Vec3<T> (0, 1, 0)).normalized ();
            else
                v = (f0 % Vec3<T> (0, 0, 1)).normalized ();
        }
    }

    return *this;
}